

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramInputAttacher::drawContainer
          (ShaderProgramInputAttacher *this,GLuint program,Surface *dst)

{
  ContextWrapper *this_00;
  RenderContext *renderCtx;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TestError *pTVar3;
  Rectangle viewport;
  Random rnd;
  CheckedShader vtxShader;
  GLint linkStatus;
  uint uStack_1a4;
  ostringstream local_1a0 [376];
  
  deRandom_init(&rnd.m_rnd,program);
  renderCtx = (this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkStatus,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,(allocator<char> *)&viewport);
  CheckedShader::CheckedShader(&vtxShader,renderCtx,SHADERTYPE_VERTEX,(string *)&linkStatus);
  std::__cxx11::string::~string((string *)&linkStatus);
  viewport = randomViewport((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx,0x80,
                            0x80,&rnd);
  iVar1 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x10))(program,vtxShader.super_Shader.m_shader);
  iVar1 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0xce8))(program);
  _linkStatus = (pointer)((ulong)uStack_1a4 << 0x20);
  iVar1 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x9d8))(program,0x8b82,&linkStatus);
  if (linkStatus == 0) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,(char *)0x0,"linkStatus != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
               ,0x20a);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  _linkStatus = (pointer)((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"// Attached a temporary vertex shader and linked program ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&linkStatus,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  setViewport((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx,&viewport);
  _linkStatus = (pointer)((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"// Positioned viewport randomly");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&linkStatus,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &(this->super_InputAttacher).super_ContextWrapper;
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  glu::CallLogWrapper::glUseProgram(&this_00->super_CallLogWrapper,program);
  iVar1 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var_02,iVar1) + 0x780))(program);
  if (-1 < iVar1) {
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar2) + 0x610))(iVar1);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_04,iVar2) + 0x1c0))(0,0,0,0x3f800000);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_05,iVar2) + 0x188))(0x4100);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_06,iVar2) + 0x19f0))
              (iVar1,2,0x1406,0,0,drawContainer::s_vertices);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_07,iVar2) + 0x538))(4,0,3);
    iVar2 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_08,iVar2) + 0x518))(iVar1);
    _linkStatus = (pointer)((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log
    ;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"// Drew a fixed triangle");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&linkStatus,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    glu::CallLogWrapper::glUseProgram(&this_00->super_CallLogWrapper,0);
    readRectangle((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx,&viewport,dst);
    _linkStatus = (pointer)((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log
    ;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"// Copied viewport to output image");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&linkStatus,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    iVar1 = (*((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_09,iVar1) + 0x4e0))(program,vtxShader.super_Shader.m_shader);
    _linkStatus = (pointer)((this->super_InputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log
    ;
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,"// Removed temporary vertex shader");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&linkStatus,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    glu::Shader::~Shader(&vtxShader.super_Shader);
    return;
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x217);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderProgramInputAttacher::drawContainer (GLuint program, Surface& dst)
{
	static const float	s_vertices[6]	= { -1.0, 0.0, 1.0, 1.0, 0.0, -1.0 };
	Random				rnd				(program);
	CheckedShader		vtxShader		(getRenderContext(),
										 SHADERTYPE_VERTEX, s_vertexShaderSrc);
	const Rectangle		viewport		= randomViewport(getRenderContext(),
														 VIEWPORT_SIZE, VIEWPORT_SIZE, rnd);

	gl().attachShader(program, vtxShader.getShader());
	gl().linkProgram(program);

	{
		GLint linkStatus = 0;
		gl().getProgramiv(program, GL_LINK_STATUS, &linkStatus);
		TCU_CHECK(linkStatus != 0);
	}

	log() << TestLog::Message
		  << "// Attached a temporary vertex shader and linked program " << program
		  << TestLog::EndMessage;

	setViewport(getRenderContext(), viewport);
	log() << TestLog::Message << "// Positioned viewport randomly" << TestLog::EndMessage;

	glUseProgram(program);
	{
		GLint posLoc = gl().getAttribLocation(program, "pos");
		TCU_CHECK(posLoc >= 0);

		gl().enableVertexAttribArray(posLoc);

		gl().clearColor(0, 0, 0, 1);
		gl().clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl().vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, s_vertices);
		gl().drawArrays(GL_TRIANGLES, 0, 3);

		gl().disableVertexAttribArray(posLoc);
		log () << TestLog::Message << "// Drew a fixed triangle" << TestLog::EndMessage;
	}
	glUseProgram(0);

	readRectangle(getRenderContext(), viewport, dst);
	log() << TestLog::Message << "// Copied viewport to output image" << TestLog::EndMessage;

	gl().detachShader(program, vtxShader.getShader());
	log() << TestLog::Message << "// Removed temporary vertex shader" << TestLog::EndMessage;
}